

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O3

UBool CnvExtAddTable(NewConverter *cnvData,UCMTable *table,UConverterStaticData *staticData)

{
  short *psVar1;
  char cVar2;
  int32_t *piVar3;
  UChar32 *pUVar4;
  int *piVar5;
  bool bVar6;
  UBool UVar7;
  uint32_t defaultValue;
  uint32_t value;
  ulong uVar8;
  UToolMemory *pUVar9;
  UCMapping *pUVar10;
  UCMapping *pUVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  byte bVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  UChar32 c;
  int iVar21;
  uint uVar22;
  int iVar23;
  int limit;
  ulong uVar24;
  
  if ((table->unicodeMask & 2) == 0) {
    staticData->conversionType = '\x02';
    pUVar11 = table->mappings;
    piVar3 = table->reverseMap;
    uVar22 = table->mappingsLength;
    uVar8 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar24 = 0;
LAB_001da556:
      bVar6 = (int)(uint)uVar24 < (int)uVar22;
      uVar22 = (uint)uVar24;
      if (bVar6) {
        uVar14 = uVar24 & 0xffffffff;
        do {
          cVar2 = pUVar11[piVar3[uVar14]].f;
          if ((cVar2 == '\x03') || (cVar2 == '\0')) {
            iVar20 = (int)uVar24;
            uVar24 = (ulong)(iVar20 + 1);
            piVar3[iVar20] = piVar3[uVar14];
          }
          uVar22 = (uint)uVar24;
          uVar14 = uVar14 + 1;
        } while (uVar8 != uVar14);
      }
    }
    else {
      uVar24 = 0;
      do {
        cVar2 = pUVar11[piVar3[uVar24]].f;
        if ((cVar2 != '\x03') && (cVar2 != '\0')) goto LAB_001da556;
        uVar24 = uVar24 + 1;
      } while (uVar8 != uVar24);
    }
    pUVar9 = utm_open("cnv extension toUTable",0x10000,0x1f0000,4);
    cnvData[1].isValid = (_func_UBool_NewConverter_ptr_uint8_t_ptr_int32_t *)pUVar9;
    pUVar9 = utm_open("cnv extension toUUChars",0x10000,0x40000,2);
    cnvData[1].addTable =
         (_func_UBool_NewConverter_ptr_UCMTable_ptr_UConverterStaticData_ptr *)pUVar9;
    uVar8 = 0;
    UVar7 = generateToUTable((CnvExtData *)cnvData,table,0,uVar22,0,0);
    if (UVar7 != '\0') {
      iVar20 = table->mappingsLength;
      if (0 < iVar20) {
        piVar3 = table->reverseMap;
        pUVar11 = table->mappings;
        iVar13 = 0;
        uVar8 = 0;
        do {
          bVar15 = pUVar11->f;
          if ((char)bVar15 < '\0') {
LAB_001da61b:
            if ((bVar15 == 4) || ((bVar15 == 2 && (pUVar11->bLen == '\x01')))) goto LAB_001da638;
          }
          else {
            bVar15 = bVar15 & 0xf;
            pUVar11->f = bVar15;
            if (1 < bVar15) goto LAB_001da61b;
LAB_001da638:
            iVar19 = (int)uVar8;
            uVar8 = (ulong)(iVar19 + 1);
            piVar3[iVar19] = iVar13;
            cVar2 = pUVar11->uLen;
            if (1 < (long)cVar2) {
              iVar19 = pUVar11->u;
              pUVar4 = table->codePoints;
              iVar17 = 2;
              lVar16 = 1;
              do {
                uVar22 = pUVar4[iVar19 + lVar16];
                lVar12 = (long)iVar17;
                if (uVar22 < 0x10000) {
                  iVar17 = iVar17 + 1;
                  *(ushort *)((long)pUVar4 + lVar12 * 2 + (long)iVar19 * 4) = (ushort)uVar22;
                }
                else {
                  *(short *)((long)pUVar4 + lVar12 * 2 + (long)iVar19 * 4) =
                       (short)(uVar22 >> 10) + -0x2840;
                  iVar17 = iVar17 + 2;
                  *(ushort *)((long)pUVar4 + lVar12 * 2 + (long)iVar19 * 4 + 2) =
                       (ushort)uVar22 & 0x3ff | 0xdc00;
                }
                lVar16 = lVar16 + 1;
              } while (cVar2 != lVar16);
              pUVar11->uLen = (int8_t)iVar17;
            }
          }
          pUVar11 = pUVar11 + 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 != iVar20);
      }
      pUVar9 = utm_open("cnv extension fromUTableUChars",0x10000,0x1000000,2);
      cnvData[1].write =
           (_func_uint32_t_NewConverter_ptr_UConverterStaticData_ptr_UNewDataMemory_ptr_int32_t *)
           pUVar9;
      pUVar9 = utm_open("cnv extension fromUTableValues",0x10000,0x1000000,4);
      cnvData[2].close = (_func_void_NewConverter_ptr *)pUVar9;
      pUVar9 = utm_open("cnv extension fromUBytes",0x10000,0x1000000,1);
      cnvData[2].isValid = (_func_UBool_NewConverter_ptr_uint8_t_ptr_int32_t *)pUVar9;
      *(undefined8 *)((long)&cnvData[0x7002].addTable + 4) = 0x1000000040;
      *(undefined4 *)((long)&cnvData[0x5002].addTable + 4) = 0x80000001;
      *(undefined4 *)((long)&cnvData[0x7002].write + 4) = 2;
      utm_alloc((UToolMemory *)cnvData[1].write);
      utm_alloc((UToolMemory *)cnvData[2].close);
      iVar20 = (int)uVar8;
      if (iVar20 != 0) {
        pUVar11 = table->mappings;
        piVar5 = table->reverseMap;
        pUVar10 = pUVar11 + *piVar5;
        if (pUVar10->uLen != '\x01') {
          pUVar10 = (UCMapping *)(table->codePoints + pUVar10->u);
        }
        if (0 < iVar20) {
          c = pUVar10->u;
          iVar13 = 0;
          do {
            iVar17 = iVar13 + 1;
            iVar19 = iVar17;
            if (iVar17 < iVar20) {
              iVar19 = iVar20;
            }
            limit = iVar13;
            lVar16 = (long)iVar13;
            do {
              iVar23 = limit;
              lVar16 = lVar16 + 1;
              iVar21 = c;
              limit = iVar19;
              iVar18 = iVar19 + -1;
              if ((long)uVar8 <= lVar16) break;
              pUVar10 = pUVar11 + piVar5[lVar16];
              if (pUVar10->uLen != '\x01') {
                pUVar10 = (UCMapping *)(table->codePoints + pUVar10->u);
              }
              iVar21 = pUVar10->u;
              limit = iVar23 + 1;
              iVar18 = iVar23;
            } while (iVar21 == c);
            iVar19 = piVar5[iVar13];
            defaultValue = 0;
            if (pUVar11[iVar19].uLen == '\x01') {
              if ((iVar13 < iVar18) && (pUVar11[piVar5[iVar17]].uLen == '\x01')) {
                fwrite("error: multiple mappings from same Unicode code points\n",0x37,1,_stderr);
                ucm_printMapping(table,pUVar11 + iVar19,(FILE *)_stderr);
                ucm_printMapping(table,pUVar11 + piVar5[iVar17],(FILE *)_stderr);
                goto LAB_001da903;
              }
              defaultValue = getFromUBytesValue((CnvExtData *)cnvData,table,pUVar11 + iVar19);
              iVar13 = iVar17;
            }
            if (iVar13 == limit) {
              addFromUTrieEntry((CnvExtData *)cnvData,c,defaultValue);
            }
            else {
              value = utm_countItems((UToolMemory *)cnvData[2].close);
              addFromUTrieEntry((CnvExtData *)cnvData,c,value);
              UVar7 = generateFromUTable((CnvExtData *)cnvData,table,iVar13,limit,2,defaultValue);
              if (UVar7 == '\0') goto LAB_001da903;
            }
            c = iVar21;
            iVar13 = limit;
          } while (limit < iVar20);
        }
      }
      iVar20 = *(int *)&cnvData[0x7002].addTable;
      uVar8 = 1;
      if (0 < (long)iVar20) {
        lVar16 = 0;
        do {
          psVar1 = (short *)((long)&cnvData[2].addTable + lVar16 * 2);
          *psVar1 = *psVar1 + (short)iVar20;
          lVar16 = lVar16 + 1;
        } while (iVar20 != lVar16);
      }
    }
  }
  else {
    CnvExtAddTable_cold_1();
LAB_001da903:
    uVar8 = 0;
  }
  return (UBool)uVar8;
}

Assistant:

static UBool
CnvExtAddTable(NewConverter *cnvData, UCMTable *table, UConverterStaticData *staticData) {
    CnvExtData *extData;

    if(table->unicodeMask&UCNV_HAS_SURROGATES) {
        fprintf(stderr, "error: contains mappings for surrogate code points\n");
        return FALSE;
    }

    staticData->conversionType=UCNV_MBCS;

    extData=(CnvExtData *)cnvData;

    /*
     * assume that the table is sorted
     *
     * call the functions in this order because
     * makeToUTable() modifies the original reverseMap,
     * makeFromUTable() writes a whole new mapping into reverseMap
     */
    return
        makeToUTable(extData, table) &&
        makeFromUTable(extData, table);
}